

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::Generator::CreateObjectsBox
          (Generator *this,Sampler<double> *sampler,ChVector<double> *pos,ChVector<double> *hdims,
          ChVector<double> *vel)

{
  int iVar1;
  double in_XMM0_Qa;
  PointVector points;
  PointVector local_48;
  
  normalizeMixture(this);
  (*sampler->_vptr_Sampler[2])(sampler);
  iVar1 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x2f])
                    ();
  if (iVar1 == 1) {
    in_XMM0_Qa = calcMinSeparation(this,in_XMM0_Qa);
  }
  (*sampler->_vptr_Sampler[3])(in_XMM0_Qa,sampler);
  Sampler<double>::SampleBox(&local_48,sampler,pos,hdims);
  createObjects(this,&local_48,vel);
  if (local_48.
      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Generator::CreateObjectsBox(Sampler<double>& sampler,
                                 const ChVector<>& pos,
                                 const ChVector<>& hdims,
                                 const ChVector<>& vel) {
    // Normalize the mixture ratios
    normalizeMixture();

    // Generate the object locations
    double sep = sampler.GetSeparation();
    if (m_system->GetContactMethod() == ChContactMethod::SMC)
        sep = calcMinSeparation(sep);
    sampler.SetSeparation(sep);

    PointVector points = sampler.SampleBox(pos, hdims);
    createObjects(points, vel);
}